

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall ParserTest_BasicPhrases_Test::TestBody(ParserTest_BasicPhrases_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_dc8;
  AssertHelper local_da8;
  Message local_da0;
  allocator local_d91;
  string local_d90;
  bool local_d69;
  undefined1 local_d68 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_d38;
  Message local_d30;
  allocator local_d21;
  string local_d20;
  bool local_cf9;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_cc8;
  Message local_cc0;
  allocator local_cb1;
  string local_cb0;
  bool local_c89;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_c58;
  Message local_c50;
  allocator local_c41;
  string local_c40;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_be8;
  Message local_be0;
  allocator local_bd1;
  string local_bd0;
  bool local_ba9;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_b78;
  Message local_b70;
  allocator local_b61;
  string local_b60;
  bool local_b39;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_b08;
  Message local_b00;
  allocator local_af1;
  string local_af0;
  bool local_ac9;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_a98;
  Message local_a90;
  allocator local_a81;
  string local_a80;
  bool local_a59;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_a28;
  Message local_a20;
  allocator local_a11;
  string local_a10;
  bool local_9e9;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_9b8;
  Message local_9b0;
  allocator local_9a1;
  string local_9a0;
  bool local_979;
  undefined1 local_978 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_948;
  Message local_940;
  allocator local_931;
  string local_930;
  bool local_909;
  undefined1 local_908 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_8d8;
  Message local_8d0;
  allocator local_8c1;
  string local_8c0;
  bool local_899;
  undefined1 local_898 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_868;
  Message local_860;
  allocator local_851;
  string local_850;
  bool local_829;
  undefined1 local_828 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_7f8;
  Message local_7f0;
  allocator local_7e1;
  string local_7e0;
  bool local_7b9;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_788;
  Message local_780;
  allocator local_771;
  string local_770;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_718;
  Message local_710;
  allocator local_701;
  string local_700;
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_6a8;
  Message local_6a0;
  allocator local_691;
  string local_690;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_638;
  Message local_630;
  allocator local_621;
  string local_620;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_5c8;
  Message local_5c0;
  allocator local_5b1;
  string local_5b0;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_558;
  Message local_550;
  allocator local_541;
  string local_540;
  bool local_519;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_4e8;
  Message local_4e0;
  allocator local_4d1;
  string local_4d0;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_478;
  Message local_470;
  allocator local_461;
  string local_460;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_408;
  Message local_400;
  allocator local_3f1;
  string local_3f0;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_398;
  Message local_390;
  allocator local_381;
  string local_380;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_328;
  Message local_320;
  allocator local_311;
  string local_310;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2b8;
  Message local_2b0;
  allocator local_2a1;
  string local_2a0;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_248;
  Message local_240;
  allocator local_231;
  string local_230;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d8;
  Message local_1d0;
  allocator local_1c1;
  string local_1c0;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_168;
  Message local_160;
  allocator local_151;
  string local_150;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  allocator local_e1;
  string local_e0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80 [3];
  allocator local_61;
  string local_60;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  P parser;
  ParserTest_BasicPhrases_Test *this_local;
  
  anon_unknown.dwarf_38f65::P::P((P *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  local_39 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_60);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_38,
               (AssertionResult *)"parser.parse(\"\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"\n",&local_e1);
  local_b9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_e0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_b8,
               (AssertionResult *)"parser.parse(\"\\n\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"@import \'file\'",&local_151);
  local_129 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_150);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,
               (AssertionResult *)"parser.parse(\"@import \'file\'\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"@context (foo.bar > baz)",&local_1c1);
  local_199 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_1c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_198,
               (AssertionResult *)"parser.parse(\"@context (foo.bar > baz)\")","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"@context (foo x.bar > baz >)",&local_231);
  local_209 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_208,
               (AssertionResult *)"parser.parse(\"@context (foo x.bar > baz >)\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"@context (foo x.bar > # baz >)",&local_2a1);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_2a0);
  local_279 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_278,
               (AssertionResult *)"parser.parse(\"@context (foo x.bar > # baz >)\")","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"prop = \'val\'",&local_311);
  local_2e9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_310);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2e8,
               (AssertionResult *)"parser.parse(\"prop = \'val\'\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"elem.id {}",&local_381);
  local_359 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_380);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_358,
               (AssertionResult *)"parser.parse(\"elem.id {}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"elem.id {prop = \'val\'}",&local_3f1);
  local_3c9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_3f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_3c8,
               (AssertionResult *)"parser.parse(\"elem.id {prop = \'val\'}\")","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"elem.id {prop = @override \'hi\'}",&local_461);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_460);
  local_439 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_438,
               (AssertionResult *)"parser.parse(\"elem.id {prop = @override \'hi\'}\")","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4d0,"a.class.class blah > elem.id {prop=3}",&local_4d1);
  local_4a9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_4d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_4a8,
               (AssertionResult *)"parser.parse(\"a.class.class blah > elem.id {prop=3}\")","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_540,"a.class.class blah > elem.id {prop=2.3}",&local_541);
  local_519 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_540);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_518,&local_519,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_518,
               (AssertionResult *)"parser.parse(\"a.class.class blah > elem.id {prop=2.3}\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5b0,"a.class.class blah > elem.id {prop=\"val\"}",&local_5b1);
  local_589 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_5b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_588,&local_589,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_588,
               (AssertionResult *)
               "parser.parse(\"a.class.class blah > elem.id {prop=\\\"val\\\"}\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_620,"a.class.class blah : elem.id { prop=\"val\" }",&local_621);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_620);
  local_5f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_5f8,
               (AssertionResult *)
               "parser.parse(\"a.class.class blah : elem.id { prop=\\\"val\\\" }\")","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_690,"a.class.class blah elem.id prop=\"val\" }",&local_691);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_690);
  local_669 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_668,&local_669,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_668,
               (AssertionResult *)"parser.parse(\"a.class.class blah elem.id prop=\\\"val\\\" }\")",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_700,"a.class.class blah > elem.id {prop=0xAB12}",&local_701);
  local_6d9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_700);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d8,&local_6d9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_6d8,
               (AssertionResult *)"parser.parse(\"a.class.class blah > elem.id {prop=0xAB12}\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_718,&local_710);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_770,"a.class.class blah > elem. id {prop=2.3}",&local_771);
  local_749 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_770);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_748,&local_749,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_748,
               (AssertionResult *)"parser.parse(\"a.class.class blah > elem. id {prop=2.3}\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7e0,"a.class. class > elem.id {prop=\"val\"}",&local_7e1);
  local_7b9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_7e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b8,&local_7b9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_7b8,
               (AssertionResult *)"parser.parse(\"a.class. class > elem.id {prop=\\\"val\\\"}\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7f8,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper(&local_7f8);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_850,"blah",&local_851);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_850);
  local_829 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_828,&local_829,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_828,
               (AssertionResult *)"parser.parse(\"blah\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c0,"@import \'file\'; @context (foo)",&local_8c1);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_8c0);
  local_899 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_898,&local_899,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar1) {
    testing::Message::Message(&local_8d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_898,
               (AssertionResult *)"parser.parse(\"@import \'file\'; @context (foo)\")","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8d8,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper(&local_8d8);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_930,"@yuno?",&local_931);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_930);
  local_909 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_908,&local_909,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_908,
               (AssertionResult *)"parser.parse(\"@yuno?\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9a0,"@import \'file\' ; @constrain foo",&local_9a1);
  local_979 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_9a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_978,&local_979,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_978,
               (AssertionResult *)"parser.parse(\"@import \'file\' ; @constrain foo\")","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9b8,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper(&local_9b8);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a10,"a.class { @import \'file\' }",&local_a11);
  local_9e9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_a10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9e8,&local_9e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_9e8,
               (AssertionResult *)"parser.parse(\"a.class { @import \'file\' }\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a28,&local_a20);
    testing::internal::AssertHelper::~AssertHelper(&local_a28);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a80,"a.class { @context (foo) }",&local_a81);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_a80);
  local_a59 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a58,&local_a59,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_a81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar1) {
    testing::Message::Message(&local_a90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_a58,
               (AssertionResult *)"parser.parse(\"a.class { @context (foo) }\")","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a98,&local_a90);
    testing::internal::AssertHelper::~AssertHelper(&local_a98);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_af0,"elem.id { prop = \'val\'; prop2 = 31337 }",&local_af1);
  local_ac9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_af0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ac8,&local_ac9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac8);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_ac8,
               (AssertionResult *)"parser.parse(\"elem.id { prop = \'val\'; prop2 = 31337 }\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b08,&local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b60,"prop.\'val\'/a.foo/p.\'hmm\' { p = 1; }",&local_b61);
  local_b39 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_b60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b38,&local_b39,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar1) {
    testing::Message::Message(&local_b70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_b38,
               (AssertionResult *)"parser.parse(\"prop.\'val\'/a.foo/p.\'hmm\' { p = 1; }\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b78,&local_b70);
    testing::internal::AssertHelper::~AssertHelper(&local_b78);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_b70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bd0,"a b > c d {p=1}",&local_bd1);
  local_ba9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_bd0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ba8,&local_ba9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_ba8,
               (AssertionResult *)"parser.parse(\"a b > c d {p=1}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_be8,&local_be0);
    testing::internal::AssertHelper::~AssertHelper(&local_be8);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c40,"(a > b) (c > d) {p=1}",&local_c41);
  local_c19 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_c40);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c18,&local_c19,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_c18,
               (AssertionResult *)"parser.parse(\"(a > b) (c > d) {p=1}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c58,&local_c50);
    testing::internal::AssertHelper::~AssertHelper(&local_c58);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_c50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cb0,"a > b > c {p=1}",&local_cb1);
  local_c89 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_cb0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c88,&local_c89,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c88);
  if (!bVar1) {
    testing::Message::Message(&local_cc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_c88,
               (AssertionResult *)"parser.parse(\"a > b > c {p=1}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cc8,&local_cc0);
    testing::internal::AssertHelper::~AssertHelper(&local_cc8);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_cc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d20,"a > (b c) > d {p=1}",&local_d21);
  local_cf9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_d20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cf8,&local_cf9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar1) {
    testing::Message::Message(&local_d30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_cf8,
               (AssertionResult *)"parser.parse(\"a > (b c) > d {p=1}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d38,&local_d30);
    testing::internal::AssertHelper::~AssertHelper(&local_d38);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d90,"a.\"foo\" \'bar\' {\'test\' = 1}",&local_d91);
  local_d69 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_d90);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d68,&local_d69,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d68);
  if (!bVar1) {
    testing::Message::Message(&local_da0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_dc8,(internal *)local_d68,
               (AssertionResult *)"parser.parse(\"a.\\\"foo\\\" \'bar\' {\'test\' = 1}\")","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_da8,&local_da0);
    testing::internal::AssertHelper::~AssertHelper(&local_da8);
    std::__cxx11::string::~string((string *)&local_dc8);
    testing::Message::~Message(&local_da0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d68);
  anon_unknown.dwarf_38f65::P::~P((P *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ParserTest, BasicPhrases) {
  P parser;
  EXPECT_TRUE(parser.parse(""));
  EXPECT_TRUE(parser.parse("\n"));
  EXPECT_TRUE(parser.parse("@import 'file'"));
  EXPECT_TRUE(parser.parse("@context (foo.bar > baz)"));
  EXPECT_TRUE(parser.parse("@context (foo x.bar > baz >)"));
  EXPECT_FALSE(parser.parse("@context (foo x.bar > # baz >)"));
  EXPECT_TRUE(parser.parse("prop = 'val'"));
  EXPECT_TRUE(parser.parse("elem.id {}"));
  EXPECT_TRUE(parser.parse("elem.id {prop = 'val'}"));
  EXPECT_FALSE(parser.parse("elem.id {prop = @override 'hi'}"));
  EXPECT_TRUE(parser.parse("a.class.class blah > elem.id {prop=3}"));
  EXPECT_TRUE(parser.parse("a.class.class blah > elem.id {prop=2.3}"));
  EXPECT_TRUE(parser.parse("a.class.class blah > elem.id {prop=\"val\"}"));
  EXPECT_FALSE(parser.parse("a.class.class blah : elem.id { prop=\"val\" }"));
  EXPECT_FALSE(parser.parse("a.class.class blah elem.id prop=\"val\" }"));
  EXPECT_TRUE(parser.parse("a.class.class blah > elem.id {prop=0xAB12}"));
  EXPECT_TRUE(parser.parse("a.class.class blah > elem. id {prop=2.3}"));
  EXPECT_TRUE(parser.parse("a.class. class > elem.id {prop=\"val\"}"));
  EXPECT_FALSE(parser.parse("blah"));
  EXPECT_FALSE(parser.parse("@import 'file'; @context (foo)"));
  EXPECT_FALSE(parser.parse("@yuno?"));
  EXPECT_TRUE(parser.parse("@import 'file' ; @constrain foo"));
  EXPECT_TRUE(parser.parse("a.class { @import 'file' }"));
  EXPECT_FALSE(parser.parse("a.class { @context (foo) }"));
  EXPECT_TRUE(parser.parse("elem.id { prop = 'val'; prop2 = 31337 }"));
  EXPECT_TRUE(parser.parse("prop.'val'/a.foo/p.'hmm' { p = 1; }"));
  EXPECT_TRUE(parser.parse("a b > c d {p=1}"));
  EXPECT_TRUE(parser.parse("(a > b) (c > d) {p=1}"));
  EXPECT_TRUE(parser.parse("a > b > c {p=1}"));
  EXPECT_TRUE(parser.parse("a > (b c) > d {p=1}"));
  EXPECT_TRUE(parser.parse("a.\"foo\" 'bar' {'test' = 1}"));
}